

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O0

void __thiscall beast::unit_test::runner::~runner(runner *this)

{
  runner *this_local;
  
  ~runner(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~runner() = default;